

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::RepeatedField<unsigned_int>::Reserve
          (RepeatedField<unsigned_int> *this,int new_size)

{
  int iVar1;
  int iVar2;
  Arena *this_00;
  void **ppvVar3;
  undefined8 *puVar4;
  void **ppvVar5;
  void **ppvVar6;
  ulong uVar7;
  
  iVar1 = this->total_size_;
  if (iVar1 < new_size) {
    ppvVar5 = (void **)((long)this->arena_or_elements_ + -8);
    ppvVar6 = (void **)0x0;
    if (0 < iVar1) {
      ppvVar6 = ppvVar5;
    }
    ppvVar3 = &this->arena_or_elements_;
    if (iVar1 != 0) {
      ppvVar3 = ppvVar5;
    }
    this_00 = (Arena *)*ppvVar3;
    uVar7 = 4;
    if ((3 < new_size) && (uVar7 = 0x7fffffff, iVar1 < 0x40000000)) {
      if (new_size < iVar1 * 2) {
        new_size = iVar1 * 2;
      }
      uVar7 = (ulong)(uint)new_size;
    }
    if (this_00 == (Arena *)0x0) {
      puVar4 = (undefined8 *)operator_new(uVar7 * 4 + 8);
    }
    else {
      if (((byte)this_00[0x18] & 1) != 0) {
        Reserve();
      }
      puVar4 = (undefined8 *)Arena::AllocateAlignedNoHook(this_00,uVar7 * 4 + 0xf & 0x3fffffff8);
    }
    *puVar4 = this_00;
    iVar2 = this->total_size_;
    this->total_size_ = (int)uVar7;
    this->arena_or_elements_ = puVar4 + 1;
    if (0 < (long)this->current_size_) {
      memcpy(puVar4 + 1,ppvVar6 + 1,(long)this->current_size_ << 2);
    }
    if ((0 < iVar1) && (*ppvVar5 == (void *)0x0)) {
      operator_delete(ppvVar5,(long)iVar2 * 4 + 8);
      return;
    }
  }
  return;
}

Assistant:

void RepeatedField<Element>::Reserve(int new_size) {
  if (total_size_ >= new_size) return;
  Rep* old_rep = total_size_ > 0 ? rep() : NULL;
  Rep* new_rep;
  Arena* arena = GetArena();
  new_size = internal::CalculateReserveSize(total_size_, new_size);
  GOOGLE_DCHECK_LE(
      static_cast<size_t>(new_size),
      (std::numeric_limits<size_t>::max() - kRepHeaderSize) / sizeof(Element))
      << "Requested size is too large to fit into size_t.";
  size_t bytes =
      kRepHeaderSize + sizeof(Element) * static_cast<size_t>(new_size);
  if (arena == NULL) {
    new_rep = static_cast<Rep*>(::operator new(bytes));
  } else {
    new_rep = reinterpret_cast<Rep*>(Arena::CreateArray<char>(arena, bytes));
  }
  new_rep->arena = arena;
  int old_total_size = total_size_;
  // Already known: new_size >= internal::kMinRepeatedFieldAllocationSize
  // Maintain invariant:
  //     total_size_ == 0 ||
  //     total_size_ >= internal::kMinRepeatedFieldAllocationSize
  total_size_ = new_size;
  arena_or_elements_ = new_rep->elements;
  // Invoke placement-new on newly allocated elements. We shouldn't have to do
  // this, since Element is supposed to be POD, but a previous version of this
  // code allocated storage with "new Element[size]" and some code uses
  // RepeatedField with non-POD types, relying on constructor invocation. If
  // Element has a trivial constructor (e.g., int32), gcc (tested with -O2)
  // completely removes this loop because the loop body is empty, so this has no
  // effect unless its side-effects are required for correctness.
  // Note that we do this before MoveArray() below because Element's copy
  // assignment implementation will want an initialized instance first.
  Element* e = &elements()[0];
  Element* limit = e + total_size_;
  for (; e < limit; e++) {
    new (e) Element;
  }
  if (current_size_ > 0) {
    MoveArray(&elements()[0], old_rep->elements, current_size_);
  }

  // Likewise, we need to invoke destructors on the old array.
  InternalDeallocate(old_rep, old_total_size);

}